

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

void __thiscall
QtPrivate::QCalendarDateValidator::~QCalendarDateValidator(QCalendarDateValidator *this)

{
  pointer pSVar1;
  
  pSVar1 = (this->m_tokens).
           super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_tokens).
      super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>._M_impl.
      super__Vector_impl_data._M_finish != pSVar1) {
    (this->m_tokens).
    super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar1;
  }
  QList<QString>::clear(&this->m_separators);
  this->m_currentToken = -1;
  (this->m_dayValidator).super_QCalendarDateSectionValidator._vptr_QCalendarDateSectionValidator =
       (_func_int **)&PTR__QCalendarDateSectionValidator_007fd4e0;
  QLocale::~QLocale(&(this->m_dayValidator).super_QCalendarDateSectionValidator.m_locale);
  (this->m_monthValidator).super_QCalendarDateSectionValidator._vptr_QCalendarDateSectionValidator =
       (_func_int **)&PTR__QCalendarDateSectionValidator_007fd4e0;
  QLocale::~QLocale(&(this->m_monthValidator).super_QCalendarDateSectionValidator.m_locale);
  (this->m_yearValidator).super_QCalendarDateSectionValidator._vptr_QCalendarDateSectionValidator =
       (_func_int **)&PTR__QCalendarDateSectionValidator_007fd4e0;
  QLocale::~QLocale(&(this->m_yearValidator).super_QCalendarDateSectionValidator.m_locale);
  pSVar1 = (this->m_tokens).
           super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pSVar1 != (pointer)0x0) {
    operator_delete(pSVar1,(long)(this->m_tokens).
                                 super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar1);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)this);
  return;
}

Assistant:

QCalendarDateValidator::~QCalendarDateValidator()
{
    clear();
}